

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

int fast_expansion_sum_zeroelim(int elen,double *e,int flen,double *f,double *h)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  dVar11 = *e;
  dVar13 = *f;
  bVar9 = dVar11 < dVar13 == dVar13 <= -dVar11;
  if (bVar9) {
    dVar10 = f[1];
    dVar12 = dVar11;
  }
  else {
    dVar10 = dVar13;
    dVar12 = e[1];
    dVar13 = dVar11;
  }
  uVar6 = (ulong)!bVar9;
  uVar4 = (ulong)bVar9;
  uVar5 = (uint)!bVar9;
  uVar2 = (uint)bVar9;
  iVar1 = 0;
  if ((int)uVar2 < flen && (int)uVar5 < elen) {
    if (dVar12 < dVar10 == dVar10 <= -dVar12) {
      dVar11 = dVar13 + dVar10;
      dVar14 = dVar11 - dVar10;
      uVar4 = (ulong)(uVar2 + 1);
      dVar10 = f[uVar4];
    }
    else {
      dVar11 = dVar13 + dVar12;
      dVar14 = dVar11 - dVar12;
      uVar6 = (ulong)(uVar5 + 1);
      dVar12 = e[uVar6];
    }
    uVar2 = (uint)uVar4;
    uVar5 = (uint)uVar6;
    dVar13 = dVar13 - dVar14;
    if ((dVar13 != 0.0) || (NAN(dVar13))) {
      *h = dVar13;
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
    }
    dVar13 = dVar11;
    if ((int)uVar2 < flen && (int)uVar5 < elen) {
      do {
        if (dVar12 < dVar10 == dVar10 <= -dVar12) {
          dVar13 = dVar11 + dVar10;
          dVar11 = (dVar11 - (dVar13 - (dVar13 - dVar11))) + (dVar10 - (dVar13 - dVar11));
          iVar3 = (int)uVar4;
          uVar4 = (ulong)(iVar3 + 1);
          dVar10 = f[(long)iVar3 + 1];
        }
        else {
          dVar13 = dVar11 + dVar12;
          dVar11 = (dVar11 - (dVar13 - (dVar13 - dVar11))) + (dVar12 - (dVar13 - dVar11));
          iVar3 = (int)uVar6;
          uVar6 = (ulong)(iVar3 + 1);
          dVar12 = e[(long)iVar3 + 1];
        }
        uVar2 = (uint)uVar4;
        uVar5 = (uint)uVar6;
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          lVar7 = (long)iVar1;
          iVar1 = iVar1 + 1;
          h[lVar7] = dVar11;
        }
      } while (((int)uVar5 < elen) && (dVar11 = dVar13, (int)uVar2 < flen));
    }
  }
  if ((int)uVar5 < elen) {
    lVar7 = (long)(int)uVar5;
    dVar11 = dVar13;
    do {
      dVar13 = dVar11 + dVar12;
      dVar11 = (dVar11 - (dVar13 - (dVar13 - dVar11))) + (dVar12 - (dVar13 - dVar11));
      dVar12 = e[lVar7 + 1];
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        lVar8 = (long)iVar1;
        iVar1 = iVar1 + 1;
        h[lVar8] = dVar11;
      }
      lVar7 = lVar7 + 1;
      dVar11 = dVar13;
    } while (elen != lVar7);
  }
  if ((int)uVar2 < flen) {
    lVar7 = (long)(int)uVar2;
    dVar11 = dVar13;
    do {
      dVar13 = dVar11 + dVar10;
      dVar11 = (dVar11 - (dVar13 - (dVar13 - dVar11))) + (dVar10 - (dVar13 - dVar11));
      dVar10 = f[lVar7 + 1];
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        lVar8 = (long)iVar1;
        iVar1 = iVar1 + 1;
        h[lVar8] = dVar11;
      }
      lVar7 = lVar7 + 1;
      dVar11 = dVar13;
    } while (flen != lVar7);
  }
  if (((dVar13 == 0.0) && (!NAN(dVar13))) && (iVar1 != 0)) {
    return iVar1;
  }
  h[iVar1] = dVar13;
  return iVar1 + 1;
}

Assistant:

int fast_expansion_sum_zeroelim(int elen, REAL *e, int flen, REAL *f, REAL *h)
/* h cannot be e or f. */
{
  REAL Q;
  INEXACT REAL Qnew;
  INEXACT REAL hh;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  int eindex, findex, hindex;
  REAL enow, fnow;

  enow = e[0];
  fnow = f[0];
  eindex = findex = 0;
  if ((fnow > enow) == (fnow > -enow)) {
    Q = enow;
    enow = e[++eindex];
  } else {
    Q = fnow;
    fnow = f[++findex];
  }
  hindex = 0;
  if ((eindex < elen) && (findex < flen)) {
    if ((fnow > enow) == (fnow > -enow)) {
      Fast_Two_Sum(enow, Q, Qnew, hh);
      enow = e[++eindex];
    } else {
      Fast_Two_Sum(fnow, Q, Qnew, hh);
      fnow = f[++findex];
    }
    Q = Qnew;
    if (hh != 0.0) {
      h[hindex++] = hh;
    }
    while ((eindex < elen) && (findex < flen)) {
      if ((fnow > enow) == (fnow > -enow)) {
        Two_Sum(Q, enow, Qnew, hh);
        enow = e[++eindex];
      } else {
        Two_Sum(Q, fnow, Qnew, hh);
        fnow = f[++findex];
      }
      Q = Qnew;
      if (hh != 0.0) {
        h[hindex++] = hh;
      }
    }
  }
  while (eindex < elen) {
    Two_Sum(Q, enow, Qnew, hh);
    enow = e[++eindex];
    Q = Qnew;
    if (hh != 0.0) {
      h[hindex++] = hh;
    }
  }
  while (findex < flen) {
    Two_Sum(Q, fnow, Qnew, hh);
    fnow = f[++findex];
    Q = Qnew;
    if (hh != 0.0) {
      h[hindex++] = hh;
    }
  }
  if ((Q != 0.0) || (hindex == 0)) {
    h[hindex++] = Q;
  }
  return hindex;
}